

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fft_world.cc
# Opt level: O0

void sptk::world::bitrv208neg(double *a)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double x7i;
  double x7r;
  double x6i;
  double x6r;
  double x5i;
  double x5r;
  double x4i;
  double x4r;
  double x3i;
  double x3r;
  double x2i;
  double x2r;
  double x1i;
  double x1r;
  double *a_local;
  
  dVar1 = a[2];
  dVar2 = a[3];
  dVar3 = a[4];
  dVar4 = a[5];
  dVar5 = a[8];
  dVar6 = a[9];
  a[2] = a[0xe];
  a[3] = a[0xf];
  a[4] = a[6];
  a[5] = a[7];
  a[6] = a[10];
  a[7] = a[0xb];
  a[8] = dVar1;
  a[9] = dVar2;
  a[10] = a[0xc];
  a[0xb] = a[0xd];
  a[0xc] = dVar3;
  a[0xd] = dVar4;
  a[0xe] = dVar5;
  a[0xf] = dVar6;
  return;
}

Assistant:

void bitrv208neg(double *a) {
  double x1r, x1i, x2r, x2i, x3r, x3i, x4r, x4i,
    x5r, x5i, x6r, x6i, x7r, x7i;

  x1r = a[2];
  x1i = a[3];
  x2r = a[4];
  x2i = a[5];
  x3r = a[6];
  x3i = a[7];
  x4r = a[8];
  x4i = a[9];
  x5r = a[10];
  x5i = a[11];
  x6r = a[12];
  x6i = a[13];
  x7r = a[14];
  x7i = a[15];
  a[2] = x7r;
  a[3] = x7i;
  a[4] = x3r;
  a[5] = x3i;
  a[6] = x5r;
  a[7] = x5i;
  a[8] = x1r;
  a[9] = x1i;
  a[10] = x6r;
  a[11] = x6i;
  a[12] = x2r;
  a[13] = x2i;
  a[14] = x4r;
  a[15] = x4i;
}